

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O0

void scalar_rwnaf(int8_t *out,uchar *in)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  byte *in_RSI;
  long in_RDI;
  int8_t d;
  int8_t window;
  int i;
  undefined1 local_15;
  undefined4 local_14;
  
  local_15 = *in_RSI & 0x3f | 1;
  for (local_14 = 0; local_14 < 0x66; local_14 = local_14 + 1) {
    cVar1 = (local_15 & 0x3f) - 0x20;
    *(char *)(in_RDI + local_14) = cVar1;
    iVar2 = scalar_get_bit(in_RSI,(local_14 + 1) * 5 + 1);
    iVar3 = scalar_get_bit(in_RSI,(local_14 + 1) * 5 + 2);
    iVar4 = scalar_get_bit(in_RSI,(local_14 + 1) * 5 + 3);
    iVar5 = scalar_get_bit(in_RSI,(local_14 + 1) * 5 + 4);
    iVar6 = scalar_get_bit(in_RSI,(local_14 + 1) * 5 + 5);
    local_15 = (char)((int)(char)local_15 - (int)cVar1 >> 5) + (char)(iVar2 << 1) +
               (char)(iVar3 << 2) + (char)(iVar4 << 3) + (char)(iVar5 << 4) + (char)(iVar6 << 5);
  }
  *(byte *)(in_RDI + local_14) = local_15;
  return;
}

Assistant:

static void scalar_rwnaf(int8_t out[52], const unsigned char in[32]) {
    int i;
    int8_t window, d;

    window = (in[0] & (DRADIX_WNAF - 1)) | 1;
    for (i = 0; i < 51; i++) {
        d = (window & (DRADIX_WNAF - 1)) - DRADIX;
        out[i] = d;
        window = (window - d) >> RADIX;
        window += scalar_get_bit(in, (i + 1) * RADIX + 1) << 1;
        window += scalar_get_bit(in, (i + 1) * RADIX + 2) << 2;
        window += scalar_get_bit(in, (i + 1) * RADIX + 3) << 3;
        window += scalar_get_bit(in, (i + 1) * RADIX + 4) << 4;
        window += scalar_get_bit(in, (i + 1) * RADIX + 5) << 5;
    }
    out[i] = window;
}